

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  int from;
  FuncState *fs_00;
  int local_2c;
  int reg;
  int extra;
  FuncState *fs;
  expdesc *e_local;
  int nexps_local;
  int nvars_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  local_2c = nvars - nexps;
  if ((e->k == VCALL) || (e->k == VVARARG)) {
    local_2c = local_2c + 1;
    if (local_2c < 0) {
      local_2c = 0;
    }
    luaK_setreturns(fs_00,e,local_2c);
    if (1 < local_2c) {
      luaK_reserveregs(fs_00,local_2c + -1);
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg(fs_00,e);
    }
    if (0 < local_2c) {
      from = fs_00->freereg;
      luaK_reserveregs(fs_00,local_2c);
      luaK_nil(fs_00,from,local_2c);
    }
  }
  return;
}

Assistant:

static void adjust_assign (LexState *ls, int nvars, int nexps, expdesc *e) {
  FuncState *fs = ls->fs;
  int extra = nvars - nexps;
  if (hasmultret(e->k)) {
    extra++;  /* includes call itself */
    if (extra < 0) extra = 0;
    luaK_setreturns(fs, e, extra);  /* last exp. provides the difference */
    if (extra > 1) luaK_reserveregs(fs, extra-1);
  }
  else {
    if (e->k != VVOID) luaK_exp2nextreg(fs, e);  /* close last expression */
    if (extra > 0) {
      int reg = fs->freereg;
      luaK_reserveregs(fs, extra);
      luaK_nil(fs, reg, extra);
    }
  }
}